

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void henson::Serialization<henson::MemoryBuffer>::load(BinaryBuffer *bb,MemoryBuffer *x)

{
  BinaryBuffer *in_RSI;
  char *in_RDI;
  unsigned_long *in_stack_ffffffffffffffe8;
  
  load<unsigned_long>(in_RSI,in_stack_ffffffffffffffe8);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)bb,(size_type)x);
  std::vector<char,_std::allocator<char>_>::operator[]
            ((vector<char,_std::allocator<char>_> *)(in_RSI + 2),0);
  load<char>(in_RSI,in_RDI,0x316118);
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, MemoryBuffer& x)
    {
      henson::load(bb, x.position);
      x.buffer.resize(x.position);
      henson::load(bb, &x.buffer[0], x.position);
    }